

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nim.h
# Opt level: O0

double __thiscall NimState::get_result(NimState *this,int current_player_to_move)

{
  int in_ESI;
  NimState *in_RDI;
  int in_stack_00000234;
  char *in_stack_00000238;
  char *in_stack_00000240;
  double local_8;
  
  if (in_RDI->chips != 0) {
    MCTS::assertion_failed(in_stack_00000240,in_stack_00000238,in_stack_00000234);
  }
  check_invariant(in_RDI);
  if (in_RDI->player_to_move == in_ESI) {
    local_8 = 1.0;
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

double get_result(int current_player_to_move) const
	{
		attest(chips == 0);
		check_invariant();

		if (player_to_move == current_player_to_move) {
			return 1.0;
		}
		else {
			return 0.0;
		}
	}